

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O2

void __thiscall
TApp_IncorrectConstructionRequiresCannotFind_Test::TestBody
          (TApp_IncorrectConstructionRequiresCannotFind_Test *this)

{
  bool bVar1;
  Option *this_00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"--cat",(allocator *)&local_80);
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_78);
  this_00 = CLI::App::add_flag(&(this->super_TApp).app,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_70,"--nothing",(allocator *)&local_80);
    CLI::Option::requires<CLI::App>(this_00,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  testing::Message::Message((Message *)&local_80);
  testing::internal::AssertHelper::AssertHelper
            (&local_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0xa8,
             "Expected: cat->requires(\"--nothing\") throws an exception of type CLI::IncorrectConstruction.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_80);
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionRequiresCannotFind) {
    auto cat = app.add_flag("--cat");
    EXPECT_THROW(cat->requires("--nothing"), CLI::IncorrectConstruction);
}